

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O0

int Wlc_NtkProofRefine(Wlc_Ntk_t *p,Wlc_Par_t *pPars,Abc_Cex_t *pCex,Vec_Int_t *vBlacks,
                      Vec_Int_t **pvRefine)

{
  Vec_Bit_t *p_00;
  Vec_Int_t *pCex_00;
  int iVar1;
  int iVar2;
  int num_sel_pis;
  uint uVar3;
  Gia_Man_t *pFrames;
  Wlc_Ntk_t *local_90;
  int local_74;
  int i;
  int Entry;
  int num_ppis;
  Vec_Int_t *vCoreSels;
  Wlc_Ntk_t *pNtkWithChoices;
  Vec_Bit_t *vChoiceMark;
  Vec_Bit_t *vUnmark;
  Vec_Int_t *vRefine;
  Gia_Man_t *pGiaFrames;
  Vec_Int_t **pvRefine_local;
  Vec_Int_t *vBlacks_local;
  Abc_Cex_t *pCex_local;
  Wlc_Par_t *pPars_local;
  Wlc_Ntk_t *p_local;
  
  vUnmark = (Vec_Bit_t *)0x0;
  vCoreSels = (Vec_Int_t *)0x0;
  i = -1;
  if (*pvRefine != (Vec_Int_t *)0x0) {
    pGiaFrames = (Gia_Man_t *)pvRefine;
    pvRefine_local = (Vec_Int_t **)vBlacks;
    vBlacks_local = (Vec_Int_t *)pCex;
    pCex_local = (Abc_Cex_t *)pPars;
    pPars_local = (Wlc_Par_t *)p;
    iVar1 = Wlc_NtkObjNumMax(p);
    vChoiceMark = Vec_BitStart(iVar1);
    iVar1 = Vec_IntSize((Vec_Int_t *)pvRefine_local);
    pNtkWithChoices = (Wlc_Ntk_t *)Vec_BitStart(iVar1);
    for (local_74 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pGiaFrames->pName), local_74 < iVar1;
        local_74 = local_74 + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pGiaFrames->pName,local_74);
      Vec_BitWriteEntry(vChoiceMark,iVar1,1);
    }
    for (local_74 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pvRefine_local), local_74 < iVar1;
        local_74 = local_74 + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pvRefine_local,local_74);
      iVar1 = Vec_BitEntry(vChoiceMark,iVar1);
      if (iVar1 != 0) {
        Vec_BitWriteEntry((Vec_Bit_t *)pNtkWithChoices,local_74,1);
      }
    }
    if (pvRefine_local == (Vec_Int_t **)0x0) {
      local_90 = (Wlc_Ntk_t *)0x0;
    }
    else {
      local_90 = Wlc_NtkIntroduceChoices
                           ((Wlc_Ntk_t *)pPars_local,(Vec_Int_t *)pvRefine_local,(Vec_Int_t *)0x0);
    }
    pCex_00 = vBlacks_local;
    vCoreSels = (Vec_Int_t *)local_90;
    iVar1 = Wlc_NtkNumPiBits((Wlc_Ntk_t *)pPars_local);
    iVar2 = Vec_IntSize((Vec_Int_t *)pvRefine_local);
    pFrames = Wlc_NtkUnrollWithCex
                        (local_90,(Abc_Cex_t *)pCex_00,iVar1,iVar2,&i,0,pCex_local[3].iFrame);
    iVar1 = i;
    vRefine = (Vec_Int_t *)pFrames;
    if (pCex_local[3].iFrame == 0) {
      iVar2 = vBlacks_local->nSize;
      num_sel_pis = Vec_IntSize((Vec_Int_t *)pvRefine_local);
      _Entry = Wlc_NtkGetCoreSels(pFrames,iVar2 + 1,iVar1,num_sel_pis,(Vec_Bit_t *)pNtkWithChoices,0
                                  ,(Wlc_Par_t *)pCex_local,0,-1);
    }
    else {
      iVar1 = vBlacks_local->nSize;
      iVar2 = Vec_IntSize((Vec_Int_t *)pvRefine_local);
      _Entry = Wlc_NtkGetCoreSels(pFrames,iVar1 + 1,0,iVar2,(Vec_Bit_t *)pNtkWithChoices,0,
                                  (Wlc_Par_t *)pCex_local,0,-1);
    }
    Wlc_NtkFree((Wlc_Ntk_t *)vCoreSels);
    Gia_ManStop((Gia_Man_t *)vRefine);
    Vec_BitFree(vChoiceMark);
    Vec_BitFree((Vec_Bit_t *)pNtkWithChoices);
    iVar1 = Vec_IntSize(_Entry);
    if (iVar1 == 0) {
      __assert_fail("Vec_IntSize( vCoreSels )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs.c"
                    ,0x2f5,
                    "int Wlc_NtkProofRefine(Wlc_Ntk_t *, Wlc_Par_t *, Abc_Cex_t *, Vec_Int_t *, Vec_Int_t **)"
                   );
    }
    vUnmark = (Vec_Bit_t *)Vec_IntAlloc(100);
    for (local_74 = 0; iVar1 = Vec_IntSize(_Entry), local_74 < iVar1; local_74 = local_74 + 1) {
      iVar1 = Vec_IntEntry(_Entry,local_74);
      p_00 = vUnmark;
      iVar1 = Vec_IntEntry((Vec_Int_t *)pvRefine_local,iVar1);
      Vec_IntPush((Vec_Int_t *)p_00,iVar1);
    }
    Vec_IntFree(_Entry);
    if (pCex_local[4].iPo != 0) {
      iVar1 = Vec_IntSize((Vec_Int_t *)pGiaFrames->pName);
      iVar2 = Vec_IntSize((Vec_Int_t *)vUnmark);
      uVar3 = Vec_IntSize((Vec_Int_t *)pGiaFrames->pName);
      Abc_Print(1,"Proof-based refinement reduces %d (out of %d) white boxes\n",
                (ulong)(uint)(iVar1 - iVar2),(ulong)uVar3);
    }
    Vec_IntFree((Vec_Int_t *)pGiaFrames->pName);
    pGiaFrames->pName = (char *)vUnmark;
  }
  return 0;
}

Assistant:

static int Wlc_NtkProofRefine( Wlc_Ntk_t * p, Wlc_Par_t * pPars, Abc_Cex_t * pCex, Vec_Int_t * vBlacks, Vec_Int_t ** pvRefine )
{
    Gia_Man_t * pGiaFrames;
    Vec_Int_t * vRefine = NULL;
    Vec_Bit_t * vUnmark;
    Vec_Bit_t * vChoiceMark; 
    Wlc_Ntk_t * pNtkWithChoices = NULL; 
    Vec_Int_t * vCoreSels;
    int num_ppis = -1;
    int Entry, i;

    if ( *pvRefine == NULL )
        return 0;

    vUnmark = Vec_BitStart( Wlc_NtkObjNumMax( p ) );
    vChoiceMark = Vec_BitStart( Vec_IntSize( vBlacks ) );      

    Vec_IntForEachEntry( *pvRefine, Entry, i )
        Vec_BitWriteEntry( vUnmark, Entry, 1 );

    Vec_IntForEachEntry( vBlacks, Entry, i )
    {
        if ( Vec_BitEntry( vUnmark, Entry ) )
            Vec_BitWriteEntry( vChoiceMark, i, 1 );
    }

    pNtkWithChoices = vBlacks ? Wlc_NtkIntroduceChoices( p, vBlacks, NULL ) : NULL;
    pGiaFrames = Wlc_NtkUnrollWithCex( pNtkWithChoices, pCex, Wlc_NtkNumPiBits( p ), Vec_IntSize( vBlacks ), &num_ppis, 0, pPars->fProofUsePPI );

    if ( !pPars->fProofUsePPI )
        vCoreSels = Wlc_NtkGetCoreSels( pGiaFrames, pCex->iFrame+1, num_ppis, Vec_IntSize( vBlacks ), vChoiceMark, 0, pPars, 0, -1 );
    else
        vCoreSels = Wlc_NtkGetCoreSels( pGiaFrames, pCex->iFrame+1, 0, Vec_IntSize( vBlacks ), vChoiceMark, 0, pPars, 0, -1 );

    Wlc_NtkFree( pNtkWithChoices );
    Gia_ManStop( pGiaFrames );
    Vec_BitFree( vUnmark );
    Vec_BitFree( vChoiceMark );
 
    assert( Vec_IntSize( vCoreSels ) );

    vRefine = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCoreSels, Entry, i )
        Vec_IntPush( vRefine, Vec_IntEntry( vBlacks, Entry ) );

    Vec_IntFree( vCoreSels );

    if ( pPars->fVerbose )
        Abc_Print( 1, "Proof-based refinement reduces %d (out of %d) white boxes\n", Vec_IntSize( *pvRefine ) - Vec_IntSize( vRefine ), Vec_IntSize( *pvRefine ) );

    Vec_IntFree( *pvRefine );
    *pvRefine = vRefine;

    return 0;
}